

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_x86.c
# Opt level: O1

void aes_cmac_process_x86(aes_context *ctx,uint8_t *block,uint8_t *buffer,uint32_t size)

{
  int iVar1;
  uint32_t nr;
  uint uVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar6;
  __m128i alVar7;
  
  uVar3 = *(undefined4 *)block;
  uVar4 = *(undefined4 *)(block + 4);
  uVar5 = *(undefined4 *)(block + 8);
  uVar6 = *(undefined4 *)(block + 0xc);
  if (size != 0) {
    iVar1 = ctx->nr;
    uVar2 = 0;
    nr = size;
    do {
      alVar7[1]._0_4_ = iVar1;
      alVar7[0] = (longlong)ctx->key;
      alVar7[1]._4_4_ = 0;
      alVar7 = aes_encrypt_x86(alVar7,(__m128i *)buffer,nr);
      buffer = alVar7[1];
      uVar2 = uVar2 + 0x10;
      uVar3 = extraout_XMM0_Da;
      uVar4 = extraout_XMM0_Db;
      uVar5 = extraout_XMM0_Dc;
      uVar6 = extraout_XMM0_Dd;
    } while (uVar2 < size);
  }
  *(undefined4 *)block = uVar3;
  *(undefined4 *)(block + 4) = uVar4;
  *(undefined4 *)(block + 8) = uVar5;
  *(undefined4 *)(block + 0xc) = uVar6;
  return;
}

Assistant:

void aes_cmac_process_x86(const aes_context* ctx, uint8_t* block, const uint8_t* buffer, uint32_t size)
{
  const __m128i* key = (__m128i*)ctx->key;
  __m128i* data = (__m128i*)buffer;

  __m128i tmp = _mm_loadu_si128((__m128i*)block);
  for (uint32_t i = 0; i < size; i += 16)
  {
    __m128i input = _mm_loadu_si128(data++);
    tmp = _mm_xor_si128(tmp, input);
    tmp = aes_encrypt_x86(tmp, key, ctx->nr);
  }
  _mm_storeu_si128((__m128i*)block, tmp);
}